

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::NoFieldPresenceTest_CopyTwiceDefaultStringFieldTest_Test::
NoFieldPresenceTest_CopyTwiceDefaultStringFieldTest_Test
          (NoFieldPresenceTest_CopyTwiceDefaultStringFieldTest_Test *this)

{
  NoFieldPresenceTest_CopyTwiceDefaultStringFieldTest_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__NoFieldPresenceTest_CopyTwiceDefaultStringFieldTest_Test_029e0988;
  return;
}

Assistant:

TEST(NoFieldPresenceTest, CopyTwiceDefaultStringFieldTest) {
  // As an optimization, we maintain a default string in memory and messages
  // with uninitialized fields will be constructed with a pointer to this
  // default string object. The destructor should clear the field only when it
  // is "set" to a nondefault object.
  TestAllTypes src, dst;

  dst = src;
  dst = src;
}